

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr_tree.cpp
# Opt level: O0

void __thiscall expr_tree::mulSimplifs(expr_tree *this,expr_node *node)

{
  expr_node *peVar1;
  bool bVar2;
  expr_node *in_RSI;
  expr_node *tmp_1;
  expr_node *tmp;
  expr_node *in_stack_ffffffffffffffc0;
  expr_node *peVar3;
  
  bVar2 = IsZero(in_RSI->left);
  if ((bVar2) || (bVar2 = IsZero(in_RSI->right), bVar2)) {
    peVar3 = in_RSI->left;
    if (peVar3 != (expr_node *)0x0) {
      expr_node::~expr_node(in_stack_ffffffffffffffc0);
      operator_delete(peVar3,0x28);
    }
    peVar3 = in_RSI->right;
    if (peVar3 != (expr_node *)0x0) {
      expr_node::~expr_node(in_stack_ffffffffffffffc0);
      operator_delete(peVar3,0x28);
    }
    in_RSI->right = (expr_node *)0x0;
    in_RSI->left = (expr_node *)0x0;
    in_RSI->type = '\x01';
    (in_RSI->value).integer = 0;
  }
  else {
    bVar2 = IsOne(in_RSI->left);
    if (bVar2) {
      peVar3 = in_RSI->right;
      peVar1 = in_RSI->left;
      if (peVar1 != (expr_node *)0x0) {
        expr_node::~expr_node(in_stack_ffffffffffffffc0);
        operator_delete(peVar1,0x28);
      }
      in_RSI->type = peVar3->type;
      in_RSI->value = peVar3->value;
      Link(in_RSI,peVar3->left,peVar3->right);
      peVar3->right = (expr_node *)0x0;
      peVar3->left = (expr_node *)0x0;
      if (peVar3 != (expr_node *)0x0) {
        expr_node::~expr_node(peVar3);
        operator_delete(peVar3,0x28);
      }
    }
    else {
      bVar2 = IsOne(in_RSI->right);
      if (bVar2) {
        peVar3 = in_RSI->left;
        peVar1 = in_RSI->right;
        if (peVar1 != (expr_node *)0x0) {
          expr_node::~expr_node(in_stack_ffffffffffffffc0);
          operator_delete(peVar1,0x28);
        }
        in_RSI->type = peVar3->type;
        in_RSI->value = peVar3->value;
        Link(in_RSI,peVar3->left,peVar3->right);
        peVar3->right = (expr_node *)0x0;
        peVar3->left = (expr_node *)0x0;
        if (peVar3 != (expr_node *)0x0) {
          expr_node::~expr_node(in_stack_ffffffffffffffc0);
          operator_delete(peVar3,0x28);
        }
      }
    }
  }
  return;
}

Assistant:

void expr_tree::mulSimplifs(expr_node* node)
{
    
    if (IsZero(node->left) || IsZero(node->right)) {
        delete node->left;
        delete node->right;
        node->left = node->right = nullptr;
        node->type = INT;
        node->value.integer = 0;
    } else if (IsOne(node->left)) {
        expr_node* tmp = node->right;
        delete node->left;
        node->type = tmp->type;
        node->value = tmp->value;
        Link(node, tmp->left, tmp->right);
        tmp->left = tmp->right = nullptr;
        delete tmp;
    } else if (IsOne(node->right)) {
        expr_node* tmp = node->left;
        delete node->right;
        node->type = tmp->type;
        node->value = tmp->value;
        Link(node, tmp->left, tmp->right);
        tmp->left = tmp->right = nullptr;
        delete tmp;
    }
}